

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O2

int nonce_function_overflowing
              (uchar *nonce32,uchar *msg,size_t msglen,uchar *key32,uchar *xonly_pk32,uchar *algo,
              size_t algolen,void *data)

{
  nonce32[0x10] = 0xff;
  nonce32[0x11] = 0xff;
  nonce32[0x12] = 0xff;
  nonce32[0x13] = 0xff;
  nonce32[0x14] = 0xff;
  nonce32[0x15] = 0xff;
  nonce32[0x16] = 0xff;
  nonce32[0x17] = 0xff;
  nonce32[0x18] = 0xff;
  nonce32[0x19] = 0xff;
  nonce32[0x1a] = 0xff;
  nonce32[0x1b] = 0xff;
  nonce32[0x1c] = 0xff;
  nonce32[0x1d] = 0xff;
  nonce32[0x1e] = 0xff;
  nonce32[0x1f] = 0xff;
  nonce32[0] = 0xff;
  nonce32[1] = 0xff;
  nonce32[2] = 0xff;
  nonce32[3] = 0xff;
  nonce32[4] = 0xff;
  nonce32[5] = 0xff;
  nonce32[6] = 0xff;
  nonce32[7] = 0xff;
  nonce32[8] = 0xff;
  nonce32[9] = 0xff;
  nonce32[10] = 0xff;
  nonce32[0xb] = 0xff;
  nonce32[0xc] = 0xff;
  nonce32[0xd] = 0xff;
  nonce32[0xe] = 0xff;
  nonce32[0xf] = 0xff;
  return 1;
}

Assistant:

static int nonce_function_overflowing(unsigned char *nonce32, const unsigned char *msg, size_t msglen, const unsigned char *key32, const unsigned char *xonly_pk32, const unsigned char *algo, size_t algolen, void *data) {
    (void) msg;
    (void) msglen;
    (void) key32;
    (void) xonly_pk32;
    (void) algo;
    (void) algolen;
    (void) data;

    memset(nonce32, 0xFF, 32);
    return 1;
}